

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRHeader(EXRHeader *exr_header)

{
  long in_RDI;
  int i;
  undefined4 local_14;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -3;
  }
  else {
    if (*(long *)(in_RDI + 0x10868) != 0) {
      free(*(void **)(in_RDI + 0x10868));
    }
    if (*(long *)(in_RDI + 0x10878) != 0) {
      free(*(void **)(in_RDI + 0x10878));
    }
    if (*(long *)(in_RDI + 0x10880) != 0) {
      free(*(void **)(in_RDI + 0x10880));
    }
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x10860); local_14 = local_14 + 1) {
      if (*(long *)(in_RDI + (long)local_14 * 0x210 + 0x260) != 0) {
        free(*(void **)(in_RDI + (long)local_14 * 0x210 + 0x260));
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  return TINYEXR_SUCCESS;
}